

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int m_encode_splitting(aec_stream *strm)

{
  internal_state *state_00;
  int iVar1;
  aec_stream *in_RDI;
  int k;
  internal_state *state;
  
  state_00 = in_RDI->state;
  iVar1 = state_00->k;
  emit(state_00,iVar1 + 1,state_00->id_len);
  if (state_00->ref != 0) {
    emit(state_00,state_00->ref_sample,in_RDI->bits_per_sample);
  }
  emitblock_fs(strm,state._4_4_,(int)state);
  if (iVar1 != 0) {
    emitblock(in_RDI,iVar1,state_00->ref);
  }
  iVar1 = m_flush_block(in_RDI);
  return iVar1;
}

Assistant:

static int m_encode_splitting(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    int k = state->k;

    emit(state, k + 1, state->id_len);
    if (state->ref)
        emit(state, state->ref_sample, strm->bits_per_sample);

    emitblock_fs(strm, k, state->ref);
    if (k)
        emitblock(strm, k, state->ref);

    return m_flush_block(strm);
}